

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void benchmark::internal::BenchmarkImp::AddRange
               (vector<int,_std::allocator<int>_> *dst,int lo,int hi,int mult)

{
  iterator iVar1;
  int iVar2;
  char *check;
  int local_3c;
  CheckHandler local_38;
  int local_2c;
  
  local_3c = lo;
  local_2c = hi;
  if (lo < 0) {
    check = "(lo) >= (0)";
    iVar2 = 0x27d;
  }
  else {
    GetNullLogInstance();
    if (hi < lo) {
      check = "(hi) >= (lo)";
      iVar2 = 0x27e;
    }
    else {
      GetNullLogInstance();
      if (1 < mult) {
        GetNullLogInstance();
        iVar1._M_current =
             (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)dst,iVar1,&local_3c);
        }
        else {
          *iVar1._M_current = lo;
          (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        local_38.log_._0_4_ = 1;
        if (1 < (uint)hi && (uint)mult < 0x40000000) {
          iVar2 = (int)(0x7fffffff / (ulong)(uint)mult);
          if (hi <= iVar2) {
            iVar2 = hi;
          }
          do {
            if (local_3c < (int)local_38.log_) {
              iVar1._M_current =
                   (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar1._M_current ==
                  (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)dst,iVar1,(int *)&local_38);
              }
              else {
                *iVar1._M_current = (int)local_38.log_;
                (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish = iVar1._M_current + 1;
              }
            }
            local_38.log_._0_4_ = (int)local_38.log_ * mult;
          } while ((int)local_38.log_ < iVar2);
        }
        if (local_3c != hi) {
          iVar1._M_current =
               (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar1._M_current ==
              (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)dst,iVar1,&local_2c);
          }
          else {
            *iVar1._M_current = hi;
            (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar1._M_current + 1;
          }
        }
        return;
      }
      check = "(mult) >= (2)";
      iVar2 = 0x27f;
    }
  }
  CheckHandler::CheckHandler
            (&local_38,check,
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"AddRange",iVar2);
  CheckHandler::~CheckHandler(&local_38);
}

Assistant:

void BenchmarkImp::AddRange(std::vector<int>* dst, int lo, int hi, int mult) {
  CHECK_GE(lo, 0);
  CHECK_GE(hi, lo);
  CHECK_GE(mult, 2);

  // Add "lo"
  dst->push_back(lo);

  static const int kint32max = std::numeric_limits<int32_t>::max();

  // Now space out the benchmarks in multiples of "mult"
  for (int32_t i = 1; i < kint32max/mult; i *= mult) {
    if (i >= hi) break;
    if (i > lo) {
      dst->push_back(i);
    }
  }
  // Add "hi" (if different from "lo")
  if (hi != lo) {
    dst->push_back(hi);
  }
}